

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nim.h
# Opt level: O0

void __thiscall NimState::do_move(NimState *this,Move move)

{
  int in_ESI;
  int *in_RDI;
  int in_stack_00000244;
  char *in_stack_00000248;
  char *in_stack_00000250;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((in_ESI < 1) || (3 < in_ESI)) {
    MCTS::assertion_failed(in_stack_00000250,in_stack_00000248,in_stack_00000244);
  }
  check_invariant((NimState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  in_RDI[1] = in_RDI[1] - in_ESI;
  *in_RDI = 3 - *in_RDI;
  check_invariant((NimState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void do_move(Move move)
	{
		attest(move >= 1 && move <= 3);
		check_invariant();
	
		chips -= move;
		player_to_move = 3 - player_to_move;

		check_invariant();
	}